

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void pq_base_concatenate(PacketQueueBase *qdest,PacketQueueBase *q1,PacketQueueBase *q2)

{
  size_t sVar1;
  size_t sVar2;
  PacketQueueNode *local_68;
  PacketQueueNode *local_60;
  PacketQueueNode *local_58;
  PacketQueueNode *local_50;
  size_t total_size;
  PacketQueueNode *tail2;
  PacketQueueNode *head2;
  PacketQueueNode *tail1;
  PacketQueueNode *head1;
  PacketQueueBase *q2_local;
  PacketQueueBase *q1_local;
  PacketQueueBase *qdest_local;
  
  sVar1 = q1->total_size;
  sVar2 = q2->total_size;
  if ((PacketQueueBase *)(q1->end).next == q1) {
    local_50 = (PacketQueueNode *)0x0;
  }
  else {
    local_50 = (q1->end).next;
  }
  tail1 = local_50;
  if ((PacketQueueBase *)(q1->end).prev == q1) {
    local_58 = (PacketQueueNode *)0x0;
  }
  else {
    local_58 = (q1->end).prev;
  }
  if ((PacketQueueBase *)(q2->end).next == q2) {
    local_60 = (PacketQueueNode *)0x0;
  }
  else {
    local_60 = (q2->end).next;
  }
  if ((PacketQueueBase *)(q2->end).prev == q2) {
    local_68 = (PacketQueueNode *)0x0;
  }
  else {
    local_68 = (q2->end).prev;
  }
  total_size = (size_t)local_68;
  (q1->end).prev = &q1->end;
  (q1->end).next = &q1->end;
  (q2->end).prev = &q2->end;
  (q2->end).next = &q2->end;
  q2->total_size = 0;
  q1->total_size = 0;
  if (local_58 == (PacketQueueNode *)0x0) {
    tail1 = local_60;
  }
  else {
    local_58->next = local_60;
  }
  if (local_60 == (PacketQueueNode *)0x0) {
    total_size = (size_t)local_58;
  }
  else {
    local_60->prev = local_58;
  }
  if ((PacketQueueBase *)(qdest->end).next != qdest) {
    __assert_fail("qdest->end.next == &qdest->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0xd6,
                  "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                 );
  }
  if ((PacketQueueBase *)(qdest->end).prev != qdest) {
    __assert_fail("qdest->end.prev == &qdest->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0xd7,
                  "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                 );
  }
  if (tail1 == (PacketQueueNode *)0x0) {
    if (total_size != 0) {
      __assert_fail("!tail2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0xdf,
                    "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                   );
    }
  }
  else {
    if (total_size == 0) {
      __assert_fail("tail2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0xe1,
                    "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                   );
    }
    (qdest->end).next = tail1;
    (qdest->end).prev = (PacketQueueNode *)total_size;
    tail1->prev = &qdest->end;
    *(PacketQueueBase **)total_size = qdest;
    if (qdest->ic != (IdempotentCallback *)0x0) {
      queue_idempotent_callback(qdest->ic);
    }
  }
  qdest->total_size = sVar1 + sVar2;
  return;
}

Assistant:

void pq_base_concatenate(PacketQueueBase *qdest,
                         PacketQueueBase *q1, PacketQueueBase *q2)
{
    struct PacketQueueNode *head1, *tail1, *head2, *tail2;

    size_t total_size = q1->total_size + q2->total_size;

    /*
     * Extract the contents from both input queues, and empty them.
     */

    head1 = (q1->end.next == &q1->end ? NULL : q1->end.next);
    tail1 = (q1->end.prev == &q1->end ? NULL : q1->end.prev);
    head2 = (q2->end.next == &q2->end ? NULL : q2->end.next);
    tail2 = (q2->end.prev == &q2->end ? NULL : q2->end.prev);

    q1->end.next = q1->end.prev = &q1->end;
    q2->end.next = q2->end.prev = &q2->end;
    q1->total_size = q2->total_size = 0;

    /*
     * Link the two lists together, handling the case where one or
     * both is empty.
     */

    if (tail1)
        tail1->next = head2;
    else
        head1 = head2;

    if (head2)
        head2->prev = tail1;
    else
        tail2 = tail1;

    /*
     * Check the destination queue is currently empty. (If it was one
     * of the input queues, then it will be, because we emptied both
     * of those just a moment ago.)
     */

    assert(qdest->end.next == &qdest->end);
    assert(qdest->end.prev == &qdest->end);

    /*
     * If our concatenated list has anything in it, then put it in
     * dest.
     */

    if (!head1) {
        assert(!tail2);
    } else {
        assert(tail2);
        qdest->end.next = head1;
        qdest->end.prev = tail2;
        head1->prev = &qdest->end;
        tail2->next = &qdest->end;

        if (qdest->ic)
            queue_idempotent_callback(qdest->ic);
    }

    qdest->total_size = total_size;
}